

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns_resolve.cpp
# Opt level: O0

void __thiscall DNSResolve::ParseHosts(DNSResolve *this)

{
  bool bVar1;
  long *plVar2;
  mapped_type *this_00;
  string local_510 [8];
  string ip;
  string hostname;
  char *p;
  undefined1 local_4b8 [8];
  char line [400];
  char local_320 [8];
  ifstream fhost;
  char local_118 [8];
  char host_path [260];
  DNSResolve *this_local;
  
  unique0x10000252 = this;
  strcpy(local_118,"/etc/hosts");
  std::ifstream::ifstream(local_320,local_118,8);
  while( true ) {
    plVar2 = (long *)std::istream::getline(local_320,(long)local_4b8);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
    if (!bVar1) break;
    hostname.field_2._8_8_ = local_4b8;
    while( true ) {
      bVar1 = true;
      if (*(char *)hostname.field_2._8_8_ != ' ') {
        bVar1 = *(char *)hostname.field_2._8_8_ == '\t';
      }
      if (!bVar1) break;
      hostname.field_2._8_8_ = hostname.field_2._8_8_ + 1;
    }
    if ((*(char *)hostname.field_2._8_8_ != '\0') && (*(char *)hostname.field_2._8_8_ != '#')) {
      std::__cxx11::string::string((string *)(ip.field_2._M_local_buf + 8));
      std::__cxx11::string::string(local_510);
      while( true ) {
        bVar1 = false;
        if ((*(char *)hostname.field_2._8_8_ != ' ') &&
           (bVar1 = false, *(char *)hostname.field_2._8_8_ != '\t')) {
          bVar1 = *(char *)hostname.field_2._8_8_ != '\0';
        }
        if (!bVar1) break;
        hostname.field_2._8_8_ = hostname.field_2._8_8_ + 1;
        std::__cxx11::string::push_back((char)local_510);
      }
      if (*(char *)hostname.field_2._8_8_ != '\0') {
        while( true ) {
          bVar1 = true;
          if (*(char *)hostname.field_2._8_8_ != ' ') {
            bVar1 = *(char *)hostname.field_2._8_8_ == '\t';
          }
          if (!bVar1) break;
          hostname.field_2._8_8_ = hostname.field_2._8_8_ + 1;
        }
        if (*(char *)hostname.field_2._8_8_ != '\0') {
          while( true ) {
            bVar1 = false;
            if ((*(char *)hostname.field_2._8_8_ != ' ') &&
               (bVar1 = false, *(char *)hostname.field_2._8_8_ != '\t')) {
              bVar1 = *(char *)hostname.field_2._8_8_ != '\0';
            }
            if (!bVar1) break;
            hostname.field_2._8_8_ = hostname.field_2._8_8_ + 1;
            std::__cxx11::string::push_back((char)&ip + '\x18');
          }
          this_00 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](&this->hosts_,(key_type *)((long)&ip.field_2 + 8));
          std::__cxx11::string::operator=((string *)this_00,local_510);
        }
      }
      std::__cxx11::string::~string(local_510);
      std::__cxx11::string::~string((string *)(ip.field_2._M_local_buf + 8));
    }
  }
  std::ifstream::close();
  std::ifstream::~ifstream(local_320);
  return;
}

Assistant:

void DNSResolve::ParseHosts()
{
    char host_path[260];
#ifdef _WIN32
    GetWindowsDirectoryA(host_path, 260);
    strcat(host_path, "\\system32\\drivers\\etc\\hosts");
#else
    strcpy(host_path, "/etc/hosts");
#endif
    ifstream fhost(host_path);
    char line[400];
    while (fhost.getline(line, 400))
    {
        char* p = line;
        while (*p == ' ' || *p == '\t') p++;
        if (*p == '\0' || *p == '#') continue;
        string hostname, ip;
        while (*p != ' ' && *p != '\t' && *p != '\0')
        {
            ip.push_back(*p++);
        }
        if (*p == '\0') continue;
        while (*p == ' ' || *p == '\t') p++;
        if (*p == '\0') continue;
        while (*p != ' ' && *p != '\t' && *p != '\0')
        {
            hostname.push_back(*p++);
        }
        hosts_[hostname] = ip;
    }
    fhost.close();
}